

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

bool __thiscall
QDockAreaLayout::insertGap(QDockAreaLayout *this,QList<int> *path,QLayoutItem *dockWidgetItem)

{
  int iVar1;
  Data *pDVar2;
  CutResult CVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QList<int> local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  local_40 = 1;
  local_48 = -1;
  CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
  if (CVar3 < Full) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (int *)0x0;
    local_68.d.size = 0;
  }
  else if (CVar3 == Full) {
    local_68.d.d = (path->d).d;
    local_68.d.ptr = (path->d).ptr;
    local_68.d.size = (path->d).size;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
    local_68.d.size = local_48;
    pDVar2 = local_68.d.d;
    if (local_48 == 0) {
      local_68.d.size = 0;
    }
    else {
      memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
    }
    local_68.d.d = pDVar2;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
      }
    }
  }
  QDockAreaLayoutInfo::insertGap(this->docks + iVar1,&local_68,dockWidgetItem);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::insertGap(const QList<int> &path, QLayoutItem *dockWidgetItem)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].insertGap(path.mid(1), dockWidgetItem);
}